

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IndexedExprLookup(Parse *pParse,Expr *pExpr,int target)

{
  Vdbe *p;
  bool bVar1;
  byte bVar2;
  int iVar3;
  Op *pOVar4;
  IndexedExpr *pIVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (pIVar5 = pParse->pIdxEpr; iVar3 = -1, pIVar5 != (IndexedExpr *)0x0; pIVar5 = pIVar5->pIENext)
  {
    iVar3 = pIVar5->iDataCur;
    bVar1 = true;
    if ((((-1 < iVar3) &&
         ((((pParse->iSelfTab == 0 || (bVar6 = iVar3 == pParse->iSelfTab + -1, iVar3 = -1, bVar6))
           && (iVar3 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar5->pExpr,iVar3), iVar3 == 0)) &&
          ((bVar2 = sqlite3ExprAffinity(pExpr), 0x41 < bVar2 || (pIVar5->aff == 'A')))))) &&
        ((bVar2 != 0x42 || (pIVar5->aff == 'B')))) && ((bVar2 < 0x43 || (pIVar5->aff == 'C')))) {
      if ((int)pExpr->flags < 0) {
        local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
        local_68.walkerDepth = 0;
        local_68.eCode = 0;
        local_68.mWFlags = 0;
        local_68.u.pNC = (NameContext *)0x0;
        local_68.xExprCallback = exprNodeCanReturnSubtype;
        local_68.pParse = pParse;
        if (pExpr != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pExpr);
        }
        if (local_68.eCode != 0) goto LAB_00179991;
      }
      p = pParse->pVdbe;
      if (pIVar5->bMaybeNullRow == '\0') {
        sqlite3VdbeAddOp3(p,0x5e,pIVar5->iIdxCur,pIVar5->iIdxCol,target);
        bVar1 = false;
      }
      else {
        iVar3 = p->nOp;
        sqlite3VdbeAddOp3(p,0x14,pIVar5->iIdxCur,iVar3 + 3,target);
        sqlite3VdbeAddOp3(p,0x5e,pIVar5->iIdxCur,pIVar5->iIdxCol,target);
        sqlite3VdbeAddOp3(p,9,0,0,0);
        pIVar5 = pParse->pIdxEpr;
        pParse->pIdxEpr = (IndexedExpr *)0x0;
        sqlite3ExprCode(pParse,pExpr,target);
        pParse->pIdxEpr = pIVar5;
        pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          pOVar4 = p->aOp + (long)iVar3 + 2;
        }
        pOVar4->p2 = p->nOp;
        bVar1 = false;
      }
    }
LAB_00179991:
    iVar3 = target;
    if (!bVar1) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE int sqlite3IndexedExprLookup(
  Parse *pParse,   /* The parsing context */
  Expr *pExpr,     /* The expression to potentially bypass */
  int target       /* Where to store the result of the expression */
){
  IndexedExpr *p;
  Vdbe *v;
  for(p=pParse->pIdxEpr; p; p=p->pIENext){
    u8 exprAff;
    int iDataCur = p->iDataCur;
    if( iDataCur<0 ) continue;
    if( pParse->iSelfTab ){
      if( p->iDataCur!=pParse->iSelfTab-1 ) continue;
      iDataCur = -1;
    }
    if( sqlite3ExprCompare(0, pExpr, p->pExpr, iDataCur)!=0 ) continue;
    assert( p->aff>=SQLITE_AFF_BLOB && p->aff<=SQLITE_AFF_NUMERIC );
    exprAff = sqlite3ExprAffinity(pExpr);
    if( (exprAff<=SQLITE_AFF_BLOB && p->aff!=SQLITE_AFF_BLOB)
     || (exprAff==SQLITE_AFF_TEXT && p->aff!=SQLITE_AFF_TEXT)
     || (exprAff>=SQLITE_AFF_NUMERIC && p->aff!=SQLITE_AFF_NUMERIC)
    ){
      /* Affinity mismatch on a generated column */
      continue;
    }


    /* Functions that might set a subtype should not be replaced by the
    ** value taken from an expression index if they are themselves an
    ** argument to another scalar function or aggregate.
    ** https://sqlite.org/forum/forumpost/68d284c86b082c3e */
    if( ExprHasProperty(pExpr, EP_SubtArg)
     && sqlite3ExprCanReturnSubtype(pParse, pExpr)
    ){
      continue;
    }

    v = pParse->pVdbe;
    assert( v!=0 );
    if( p->bMaybeNullRow ){
      /* If the index is on a NULL row due to an outer join, then we
      ** cannot extract the value from the index.  The value must be
      ** computed using the original expression. */
      int addr = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_IfNullRow, p->iIdxCur, addr+3, target);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
      sqlite3VdbeGoto(v, 0);
      p = pParse->pIdxEpr;
      pParse->pIdxEpr = 0;
      sqlite3ExprCode(pParse, pExpr, target);
      pParse->pIdxEpr = p;
      sqlite3VdbeJumpHere(v, addr+2);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
    }
    return target;
  }
  return -1;  /* Not found */
}